

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O0

ssize_t __thiscall LASindex::read(LASindex *this,int __fd,void *__buf,size_t __nbytes)

{
  BOOL BVar1;
  int iVar2;
  undefined7 extraout_var;
  LASquadtree *pLVar3;
  ulong uVar4;
  undefined7 extraout_var_00;
  LASinterval *pLVar5;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 uVar6;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  undefined1 local_38 [8];
  U32 version;
  char local_24 [4];
  long *plStack_20;
  char signature [4];
  ByteStreamIn *stream_local;
  LASindex *this_local;
  
  plStack_20 = (long *)CONCAT44(in_register_00000034,__fd);
  if (this->spatial != (LASquadtree *)0x0) {
    pLVar3 = this->spatial;
    if (pLVar3 != (LASquadtree *)0x0) {
      LASquadtree::~LASquadtree(pLVar3);
      operator_delete(pLVar3);
    }
    this->spatial = (LASquadtree *)0x0;
  }
  if (this->interval != (LASinterval *)0x0) {
    pLVar5 = this->interval;
    if (pLVar5 != (LASinterval *)0x0) {
      LASinterval::~LASinterval(pLVar5);
      operator_delete(pLVar5);
    }
    this->interval = (LASinterval *)0x0;
  }
  (**(code **)(*plStack_20 + 8))(plStack_20,local_24,4);
  iVar2 = strncmp(local_24,"LASX",4);
  if (iVar2 == 0) {
    (**(code **)(*plStack_20 + 0x18))(plStack_20,local_38);
    pLVar3 = (LASquadtree *)operator_new(0xa8);
    LASquadtree::LASquadtree(pLVar3);
    this->spatial = pLVar3;
    uVar4 = LASquadtree::read(this->spatial,(int)plStack_20,__buf_00,(size_t)pLVar3);
    if ((uVar4 & 1) == 0) {
      laserror<>("(LASindex): cannot read LASspatial (LASquadtree)");
      this_local._7_1_ = 0;
      uVar6 = extraout_var_00;
    }
    else {
      pLVar5 = (LASinterval *)operator_new(0x58);
      LASinterval::LASinterval(pLVar5,1000);
      this->interval = pLVar5;
      uVar4 = LASinterval::read(this->interval,(int)plStack_20,__buf_01,(size_t)pLVar5);
      if ((uVar4 & 1) == 0) {
        laserror<>("(LASindex): reading LASinterval");
        this_local._7_1_ = 0;
        uVar6 = extraout_var_01;
      }
      else {
        LASinterval::get_cells(this->interval);
        while( true ) {
          BVar1 = LASinterval::has_cells(this->interval);
          if (!BVar1) break;
          LASquadtree::manage_cell(this->spatial,this->interval->index,false);
        }
        this_local._7_1_ = 1;
        uVar6 = extraout_var_02;
      }
    }
  }
  else {
    laserror<char*>("(LASindex): wrong signature %4s instead of \'LASX\'",local_24);
    this_local._7_1_ = 0;
    uVar6 = extraout_var;
  }
  return CONCAT71(uVar6,this_local._7_1_);
}

Assistant:

BOOL LASindex::read(ByteStreamIn* stream)
{
  if (spatial)
  {
    delete spatial;
    spatial = 0;
  }
  if (interval)
  {
    delete interval;
    interval = 0;
  }
  char signature[4];
  try { stream->getBytes((U8*)signature, 4); } catch (...)
  {
    laserror("(LASindex): reading signature");
    return FALSE;
  }
  if (strncmp(signature, "LASX", 4) != 0)
  {
    laserror("(LASindex): wrong signature %4s instead of 'LASX'", signature);
    return FALSE;
  }
  U32 version;
  try { stream->get32bitsLE((U8*)&version); } catch (...)
  {
    laserror("(LASindex): reading version");
    return FALSE;
  }
  // read spatial quadtree
  spatial = new LASquadtree();
  if (!spatial->read(stream))
  {
    laserror("(LASindex): cannot read LASspatial (LASquadtree)");
    return FALSE;
  }
  // read interval
  interval = new LASinterval();
  if (!interval->read(stream))
  {
    laserror("(LASindex): reading LASinterval");
    return FALSE;
  }
  // tell spatial about the existing cells
  interval->get_cells();
  while (interval->has_cells())
  {
    spatial->manage_cell(interval->index);
  }
  return TRUE;
}